

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O3

void __thiscall
duckdb::ParquetMetaDataOperatorData::ExecuteBloomProbe
          (ParquetMetaDataOperatorData *this,ClientContext *context,
          vector<duckdb::LogicalType,_true> *return_types,OpenFileInfo *file,string *column_name,
          Value *probe)

{
  size_t __n;
  pointer pcVar1;
  ColumnDataScanState *pCVar2;
  FileMetaData *pFVar3;
  int iVar4;
  pointer pPVar5;
  reference pvVar6;
  type __args;
  TCompactProtocolT<duckdb::ThriftFileTransport> *this_00;
  idx_t iVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  type file_proto;
  Value *pVVar10;
  InvalidInputException *this_01;
  unsigned_long __n_00;
  pointer *__ptr;
  idx_t column_idx;
  ulong __n_01;
  Value *pVVar11;
  optional_idx probe_column_idx;
  shared_ptr<duckdb::ThriftFileTransport> transport;
  ConstantFilter filter;
  DataChunk current_chunk;
  ParquetOptions parquet_options;
  _Head_base<0UL,_duckdb::ParquetReader_*,_false> local_248;
  ClientContext *local_240;
  optional_idx local_238;
  _Head_base<0UL,_duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_*,_false>
  local_230;
  ThriftFileTransport *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  ColumnDataScanState *local_218;
  OpenFileInfo *local_210;
  FileMetaData *local_208;
  ParquetMetaDataOperatorData *local_200;
  Value *local_1f8;
  Allocator *local_1f0;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [88];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  DataChunk local_130 [24];
  Value *local_118;
  Value local_f0 [64];
  ClientContext local_b0 [64];
  ParquetOptions local_70;
  
  local_218 = (ColumnDataScanState *)&this->collection;
  local_200 = this;
  local_1f8 = probe;
  duckdb::ColumnDataCollection::Reset();
  ParquetOptions::ParquetOptions(&local_70,context);
  local_240 = context;
  local_210 = file;
  make_uniq<duckdb::ParquetReader,duckdb::ClientContext&,std::__cxx11::string_const&,duckdb::ParquetOptions&>
            ((duckdb *)&local_248,context,&file->path,&local_70);
  duckdb::DataChunk::DataChunk(local_130);
  duckdb::DataChunk::Initialize((ClientContext *)local_130,(vector *)local_240,(ulong)return_types);
  pPVar5 = unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>::
           operator->((unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>
                       *)&local_248);
  local_208 = ParquetReader::GetFileMetadata(pPVar5);
  local_238.index = 0xffffffffffffffff;
  for (__n_01 = 0;
      pPVar5 = unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>::
               operator->((unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>
                           *)&local_248),
      __n_01 < (ulong)(((long)(pPVar5->super_BaseFileReader).columns.
                              super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                              .
                              super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pPVar5->super_BaseFileReader).columns.
                              super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                              .
                              super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5)
      ; __n_01 = __n_01 + 1) {
    pPVar5 = unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>::
             operator->((unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>
                         *)&local_248);
    pvVar6 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
                       (&(pPVar5->super_BaseFileReader).columns,__n_01);
    __n = (pvVar6->name)._M_string_length;
    if ((__n == column_name->_M_string_length) &&
       ((__n == 0 ||
        (iVar4 = bcmp((pvVar6->name)._M_dataplus._M_p,(column_name->_M_dataplus)._M_p,__n),
        iVar4 == 0)))) {
      optional_idx::optional_idx((optional_idx *)local_1c8,__n_01);
      local_238.index = local_1c8._0_8_;
    }
  }
  if (local_238.index == 0xffffffffffffffff) {
    this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_1c8._0_8_ = local_1c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Column %s not found in %s","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    pcVar1 = (column_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar1,pcVar1 + column_name->_M_string_length);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    pcVar1 = (local_210->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar1,pcVar1 + (local_210->path)._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
              (this_01,(string *)local_1c8,&local_150,&local_170);
    __cxa_throw(this_01,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f0 = (Allocator *)duckdb::Allocator::DefaultAllocator();
  pPVar5 = unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>::
           operator->((unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>
                       *)&local_248);
  __args = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
           ::operator*(&pPVar5->file_handle);
  local_f0[0] = (Value)0x0;
  local_228 = (ThriftFileTransport *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ThriftFileTransport,std::allocator<duckdb::ThriftFileTransport>,duckdb::CachingFileHandle&,bool>
            (&_Stack_220,&local_228,(allocator<duckdb::ThriftFileTransport> *)local_1c8,__args,
             (bool *)local_f0);
  this_00 = (TCompactProtocolT<duckdb::ThriftFileTransport> *)operator_new(0xb0);
  local_1c8._0_8_ = local_228;
  local_1c8._8_8_ = _Stack_220._M_pi;
  local_228 = (ThriftFileTransport *)0x0;
  _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>::TCompactProtocolT
            (this_00,(shared_ptr<duckdb::ThriftFileTransport> *)local_1c8);
  local_230._M_head_impl = this_00;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  pPVar5 = unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>::
           operator->((unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>
                       *)&local_248);
  pFVar3 = local_208;
  iVar7 = optional_idx::GetIndex(&local_238);
  vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
            (&(pPVar5->super_BaseFileReader).columns,iVar7);
  duckdb::Value::CastAs(local_b0,(LogicalType *)local_1f8,SUB81(local_240,0));
  duckdb::ConstantFilter::ConstantFilter((ConstantFilter *)local_1c8,0x19,local_b0);
  duckdb::Value::~Value((Value *)local_b0);
  if ((pFVar3->row_groups).
      super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (pFVar3->row_groups).
      super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pVVar10 = (Value *)0x0;
  }
  else {
    local_240 = (ClientContext *)&pFVar3->row_groups;
    __n_00 = 0;
    pVVar11 = (Value *)0x0;
    do {
      pvVar8 = vector<duckdb_parquet::RowGroup,_true>::operator[]
                         ((vector<duckdb_parquet::RowGroup,_true> *)local_240,__n_00);
      iVar7 = optional_idx::GetIndex(&local_238);
      pvVar9 = vector<duckdb_parquet::ColumnChunk,_true>::operator[](&pvVar8->columns,iVar7);
      file_proto = unique_ptr<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_std::default_delete<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_>,_true>
                   ::operator*((unique_ptr<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_std::default_delete<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_>,_true>
                                *)&local_230);
      ParquetStatisticsUtils::BloomFilterExcludes
                ((TableFilter *)local_1c8,&pvVar9->meta_data,(TProtocol *)file_proto,local_1f0);
      local_1e8[0] = local_1d8;
      pcVar1 = (local_210->path)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1e8,pcVar1,pcVar1 + (local_210->path)._M_string_length);
      duckdb::Value::Value(local_f0);
      duckdb::DataChunk::SetValue((ulong)local_130,0,pVVar11);
      duckdb::Value::~Value(local_f0);
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0]);
      }
      NumericCastImpl<long,_unsigned_long,_false>::Convert(__n_00);
      duckdb::Value::BIGINT((long)local_f0);
      duckdb::DataChunk::SetValue((ulong)local_130,1,pVVar11);
      duckdb::Value::~Value(local_f0);
      duckdb::Value::BOOLEAN(SUB81(local_f0,0));
      duckdb::DataChunk::SetValue((ulong)local_130,2,pVVar11);
      duckdb::Value::~Value(local_f0);
      pVVar10 = pVVar11 + 1;
      if ((Value *)0x7fe < pVVar11) {
        local_118 = pVVar10;
        duckdb::ColumnDataCollection::Append((DataChunk *)local_218);
        duckdb::DataChunk::Reset();
        pVVar10 = (Value *)0x0;
      }
      __n_00 = __n_00 + 1;
      pVVar11 = pVVar10;
    } while (__n_00 < (ulong)(((long)(local_208->row_groups).
                                     super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                                     .
                                     super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_208->row_groups).
                                     super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                                     .
                                     super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             -0x5555555555555555));
  }
  pCVar2 = local_218;
  local_118 = pVVar10;
  duckdb::ColumnDataCollection::Append((DataChunk *)local_218);
  duckdb::ColumnDataCollection::InitializeScan(pCVar2,(char)local_200 + 0x78);
  local_1c8._0_8_ = duckdb::ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>;
  duckdb::Value::~Value((Value *)(local_1c8 + 0x10));
  if (local_230._M_head_impl != (TCompactProtocolT<duckdb::ThriftFileTransport> *)0x0) {
    (*((local_230._M_head_impl)->
      super_TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
      ).super_TProtocolDefaults.super_TProtocol._vptr_TProtocol[1])();
  }
  if (_Stack_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_220._M_pi);
  }
  duckdb::DataChunk::~DataChunk(local_130);
  if (local_248._M_head_impl != (ParquetReader *)0x0) {
    (*((local_248._M_head_impl)->super_BaseFileReader)._vptr_BaseFileReader[1])();
  }
  std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector(&local_70.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         );
  if (local_70.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.encryption_config.internal.
               super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ParquetMetaDataOperatorData::ExecuteBloomProbe(ClientContext &context, const vector<LogicalType> &return_types,
                                                    const OpenFileInfo &file, const string &column_name,
                                                    const Value &probe) {
	collection.Reset();
	ParquetOptions parquet_options(context);
	auto reader = make_uniq<ParquetReader>(context, file.path, parquet_options);
	idx_t count = 0;
	DataChunk current_chunk;
	current_chunk.Initialize(context, return_types);
	auto meta_data = reader->GetFileMetadata();

	optional_idx probe_column_idx;
	for (idx_t column_idx = 0; column_idx < reader->columns.size(); column_idx++) {
		if (reader->columns[column_idx].name == column_name) {
			probe_column_idx = column_idx;
		}
	}

	if (!probe_column_idx.IsValid()) {
		throw InvalidInputException("Column %s not found in %s", column_name, file.path);
	}

	auto &allocator = Allocator::DefaultAllocator();
	auto transport = std::make_shared<ThriftFileTransport>(reader->GetHandle(), false);
	auto protocol =
	    make_uniq<duckdb_apache::thrift::protocol::TCompactProtocolT<ThriftFileTransport>>(std::move(transport));

	D_ASSERT(!probe.IsNull());
	ConstantFilter filter(ExpressionType::COMPARE_EQUAL,
	                      probe.CastAs(context, reader->GetColumns()[probe_column_idx.GetIndex()].type));

	for (idx_t row_group_idx = 0; row_group_idx < meta_data->row_groups.size(); row_group_idx++) {
		auto &row_group = meta_data->row_groups[row_group_idx];
		auto &column = row_group.columns[probe_column_idx.GetIndex()];

		auto bloom_excludes =
		    ParquetStatisticsUtils::BloomFilterExcludes(filter, column.meta_data, *protocol, allocator);
		current_chunk.SetValue(0, count, Value(file.path));
		current_chunk.SetValue(1, count, Value::BIGINT(NumericCast<int64_t>(row_group_idx)));
		current_chunk.SetValue(2, count, Value::BOOLEAN(bloom_excludes));

		count++;
		if (count >= STANDARD_VECTOR_SIZE) {
			current_chunk.SetCardinality(count);
			collection.Append(current_chunk);

			count = 0;
			current_chunk.Reset();
		}
	}

	current_chunk.SetCardinality(count);
	collection.Append(current_chunk);
	collection.InitializeScan(scan_state);
}